

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

bool __thiscall
DescriptorCache::GetCachedLastHardenedExtPubKey
          (DescriptorCache *this,uint32_t key_exp_pos,CExtPubKey *xpub)

{
  pointer pvVar1;
  void *in_RDX;
  unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  const_iterator *it;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  _Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> *__x;
  bool local_21;
  _Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
       ::find(in_RDI,(key_type *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  __x = local_18;
  std::
  unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
  ::end(in_RDI);
  local_21 = std::__detail::operator==
                       (__x,(_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> *
                            )in_RDI);
  if (!local_21) {
    pvVar1 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>
                         *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    memcpy(in_RDX,&pvVar1->second,0x71);
  }
  local_21 = !local_21;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool DescriptorCache::GetCachedLastHardenedExtPubKey(uint32_t key_exp_pos, CExtPubKey& xpub) const
{
    const auto& it = m_last_hardened_xpubs.find(key_exp_pos);
    if (it == m_last_hardened_xpubs.end()) return false;
    xpub = it->second;
    return true;
}